

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Psbt::GetPsbtVersion(Psbt *this)

{
  CfdException *this_00;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (this->wally_psbt_pointer_ != (void *)0x0) {
    return *(uint32_t *)((long)this->wally_psbt_pointer_ + 0x58);
  }
  local_38._0_8_ = "cfdcore_psbt.cpp";
  local_38._8_4_ = 0xc50;
  local_38._16_8_ = "GetPsbtVersion";
  logger::warn<>((CfdSourceLocation *)local_38,"psbt pointer is null");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"psbt pointer is null.",&local_39);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Psbt::GetPsbtVersion() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }
  return psbt_pointer->version;
}